

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross_containers.hpp
# Opt level: O2

void __thiscall
diligent_spirv_cross::StringStream<4096UL,_4096UL>::reset(StringStream<4096UL,_4096UL> *this)

{
  char *pcVar1;
  Buffer *pBVar2;
  size_t sVar3;
  undefined1 *__ptr;
  char *__ptr_00;
  long lVar4;
  
  pBVar2 = (this->saved_buffers).
           super_VectorView<diligent_spirv_cross::StringStream<4096UL,_4096UL>::Buffer>.ptr;
  pcVar1 = this->stack_buffer;
  sVar3 = (this->saved_buffers).
          super_VectorView<diligent_spirv_cross::StringStream<4096UL,_4096UL>::Buffer>.buffer_size;
  for (lVar4 = 0; sVar3 * 0x18 - lVar4 != 0; lVar4 = lVar4 + 0x18) {
    __ptr = *(undefined1 **)((long)&pBVar2->buffer + lVar4);
    if (__ptr != pcVar1) {
      free(__ptr);
    }
  }
  __ptr_00 = (this->current_buffer).buffer;
  if (__ptr_00 != pcVar1) {
    free(__ptr_00);
  }
  (this->saved_buffers).super_VectorView<diligent_spirv_cross::StringStream<4096UL,_4096UL>::Buffer>
  .buffer_size = 0;
  (this->current_buffer).buffer = pcVar1;
  (this->current_buffer).offset = 0;
  (this->current_buffer).size = 0x1000;
  return;
}

Assistant:

void reset()
	{
		for (auto &saved : saved_buffers)
			if (saved.buffer != stack_buffer)
				free(saved.buffer);
		if (current_buffer.buffer != stack_buffer)
			free(current_buffer.buffer);

		saved_buffers.clear();
		current_buffer.buffer = stack_buffer;
		current_buffer.offset = 0;
		current_buffer.size = sizeof(stack_buffer);
	}